

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O1

void duckdb::ComputePartitionIndicesFunctor::Operation<5ul>
               (Vector *hashes,Vector *partition_indices,idx_t original_count,
               SelectionVector *append_sel,idx_t append_count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  idx_t iVar4;
  UnifiedVectorFormat format;
  UnifiedVectorFormat local_78;
  
  if ((append_sel->sel_vector == (sel_t *)0x0) || (hashes->vector_type == CONSTANT_VECTOR)) {
    UnaryExecutor::
    ExecuteStandard<unsigned_long,unsigned_long,duckdb::UnaryLambdaWrapper,duckdb::ComputePartitionIndicesFunctor::Operation<5ul>(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::SelectionVector_const&,unsigned_long)::_lambda(unsigned_long)_1_>
              (hashes,partition_indices,append_count,&local_78,false,CAN_THROW_RUNTIME_ERROR);
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(hashes,original_count,&local_78);
    pdVar1 = partition_indices->data;
    psVar2 = (local_78.sel)->sel_vector;
    if (psVar2 == (sel_t *)0x0) {
      if (append_count != 0) {
        psVar2 = append_sel->sel_vector;
        iVar4 = 0;
        do {
          *(ulong *)(pdVar1 + iVar4 * 8) =
               (ulong)((uint)((ulong)*(undefined8 *)(local_78.data + (ulong)psVar2[iVar4] * 8) >>
                             0x2b) & 0x1f);
          iVar4 = iVar4 + 1;
        } while (append_count != iVar4);
      }
    }
    else if (append_count != 0) {
      psVar3 = append_sel->sel_vector;
      iVar4 = 0;
      do {
        *(ulong *)(pdVar1 + iVar4 * 8) =
             (ulong)((uint)((ulong)*(undefined8 *)(local_78.data + (ulong)psVar2[psVar3[iVar4]] * 8)
                           >> 0x2b) & 0x1f);
        iVar4 = iVar4 + 1;
      } while (append_count != iVar4);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void Operation(Vector &hashes, Vector &partition_indices, const idx_t original_count,
	                      const SelectionVector &append_sel, const idx_t append_count) {
		using CONSTANTS = RadixPartitioningConstants<radix_bits>;
		if (!append_sel.IsSet() || hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			UnaryExecutor::Execute<hash_t, hash_t>(hashes, partition_indices, append_count,
			                                       [&](hash_t hash) { return CONSTANTS::ApplyMask(hash); });
		} else {
			// We could just slice the "hashes" vector and use the UnaryExecutor
			// But slicing a dictionary vector causes SelectionData to be allocated
			// Instead, we just directly compute the partition indices using the selection vectors
			UnifiedVectorFormat format;
			hashes.ToUnifiedFormat(original_count, format);
			const auto source_data = UnifiedVectorFormat::GetData<hash_t>(format);
			const auto &source_sel = *format.sel;

			const auto target = FlatVector::GetData<hash_t>(partition_indices);

			if (source_sel.IsSet()) {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = source_sel.get_index(append_sel[i]);
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			} else {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = append_sel[i];
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			}
		}
	}